

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_err_delete_internal(mpc_input_t *i,mpc_err_t *x)

{
  int local_1c;
  int j;
  mpc_err_t *x_local;
  mpc_input_t *i_local;
  
  if (x != (mpc_err_t *)0x0) {
    for (local_1c = 0; local_1c < x->expected_num; local_1c = local_1c + 1) {
      mpc_free(i,x->expected[local_1c]);
    }
    mpc_free(i,x->expected);
    mpc_free(i,x->filename);
    mpc_free(i,x->failure);
    mpc_free(i,x);
  }
  return;
}

Assistant:

static void mpc_err_delete_internal(mpc_input_t *i, mpc_err_t *x) {
  int j;
  if (x == NULL) { return; }
  for (j = 0; j < x->expected_num; j++) { mpc_free(i, x->expected[j]); }
  mpc_free(i, x->expected);
  mpc_free(i, x->filename);
  mpc_free(i, x->failure);
  mpc_free(i, x);
}